

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QModelIndex * __thiscall
QAbstractItemViewPrivate::indexForEditor
          (QModelIndex *__return_storage_ptr__,QAbstractItemViewPrivate *this,QWidget *editor)

{
  Data *pDVar1;
  Span *pSVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  const_iterator cVar4;
  QWidget *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->indexEditorHash).d;
  local_18 = editor;
  if ((pDVar1 == (Data *)0x0) || (pDVar1->size == 0)) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_004e19e9;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    cVar4 = QHash<QWidget*,QPersistentModelIndex>::constFindImpl<QWidget*>
                      ((QHash<QWidget*,QPersistentModelIndex> *)&this->editorIndexHash,&local_18);
    if (cVar4.i.d == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0 &&
        cVar4.i.bucket == 0) {
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    }
    else {
      pSVar2 = (cVar4.i.d)->spans;
      uVar3 = cVar4.i.bucket >> 7;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (__return_storage_ptr__,
                 (QPersistentModelIndex *)
                 (pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)cVar4.i.bucket & 0x7f]].storage.
                  data + 8));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_004e19e9:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QAbstractItemViewPrivate::indexForEditor(QWidget *editor) const
{
    // do not try to search to avoid slow implicit cast from QModelIndex to QPersistentModelIndex
    if (indexEditorHash.isEmpty())
        return QModelIndex();

   QEditorIndexHash::const_iterator it = editorIndexHash.find(editor);
    if (it == editorIndexHash.end())
        return QModelIndex();

    return it.value();
}